

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O3

CompileInfo * __thiscall xe::ri::List::allocItem<xe::ri::CompileInfo>(List *this)

{
  CompileInfo *pCVar1;
  CompileInfo *local_18;
  
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::reserve
            (&this->m_items,
             ((long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + 1);
  pCVar1 = (CompileInfo *)operator_new(0x88);
  (pCVar1->super_Item).m_type = TYPE_COMPILEINFO;
  (pCVar1->super_Item)._vptr_Item = (_func_int **)&PTR__CompileInfo_0011eaf8;
  (pCVar1->name)._M_dataplus._M_p = (pointer)&(pCVar1->name).field_2;
  (pCVar1->name)._M_string_length = 0;
  (pCVar1->name).field_2._M_local_buf[0] = '\0';
  (pCVar1->description)._M_dataplus._M_p = (pointer)&(pCVar1->description).field_2;
  (pCVar1->description)._M_string_length = 0;
  (pCVar1->description).field_2._M_local_buf[0] = '\0';
  pCVar1->compileStatus = false;
  (pCVar1->infoLog).super_Item.m_type = TYPE_INFOLOG;
  (pCVar1->infoLog).super_Item._vptr_Item = (_func_int **)&PTR__InfoLog_0011e9e0;
  (pCVar1->infoLog).log._M_dataplus._M_p = (pointer)&(pCVar1->infoLog).log.field_2;
  (pCVar1->infoLog).log._M_string_length = 0;
  (pCVar1->infoLog).log.field_2._M_local_buf[0] = '\0';
  local_18 = pCVar1;
  std::vector<xe::ri::Item*,std::allocator<xe::ri::Item*>>::emplace_back<xe::ri::Item*>
            ((vector<xe::ri::Item*,std::allocator<xe::ri::Item*>> *)this,(Item **)&local_18);
  return pCVar1;
}

Assistant:

T* List::allocItem (void)
{
	m_items.reserve(m_items.size()+1);
	T* item = new T();
	m_items.push_back(static_cast<ri::Item*>(item));
	return item;
}